

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET hal_h265e_vepu511_prepare(void *hal)

{
  uint *puVar1;
  int local_24;
  RK_S32 i;
  MppEncPrepCfg *prep;
  H265eV511HalContext *ctx;
  void *hal_local;
  
  puVar1 = (uint *)(*(long *)((long)hal + 0x3b0) + 8);
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter %p\n","hal_h265e_vepu511_prepare",hal);
  }
  if ((*puVar1 & 5) != 0) {
    vepu511_h265_setup_hal_bufs((H265eV511HalContext *)hal);
    for (local_24 = 0; local_24 < *(int *)((long)hal + 0x3d8); local_24 = local_24 + 1) {
      hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),local_24);
    }
    *puVar1 = 0;
  }
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave %p\n","hal_h265e_vepu511_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265e_vepu511_prepare(void *hal)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    MppEncPrepCfg *prep = &ctx->cfg->prep;

    hal_h265e_dbg_func("enter %p\n", hal);

    if (prep->change & (MPP_ENC_PREP_CFG_CHANGE_INPUT | MPP_ENC_PREP_CFG_CHANGE_FORMAT)) {
        RK_S32 i;

        // pre-alloc required buffers to reduce first frame delay
        vepu511_h265_setup_hal_bufs(ctx);
        for (i = 0; i < ctx->max_buf_cnt; i++)
            hal_bufs_get_buf(ctx->dpb_bufs, i);

        prep->change = 0;
    }

    hal_h265e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}